

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemoryReporter.h
# Opt level: O0

int __thiscall jaegertracing::reporters::InMemoryReporter::spansSubmitted(InMemoryReporter *this)

{
  size_type sVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  InMemoryReporter *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->_mutex);
  sVar1 = std::vector<jaegertracing::Span,_std::allocator<jaegertracing::Span>_>::size
                    (&this->_spans);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return (int)sVar1;
}

Assistant:

int spansSubmitted() const noexcept
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _spans.size();
    }